

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O1

int ARKodeGetNumConstrFails(void *arkode_mem,long *nconstrfails)

{
  int iVar1;
  
  if (arkode_mem == (void *)0x0) {
    iVar1 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,0x95a,"ARKodeGetNumConstrFails",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
  }
  else {
    *nconstrfails = *(long *)((long)arkode_mem + 0x330);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int ARKodeGetNumConstrFails(void* arkode_mem, long int* nconstrfails)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  *nconstrfails = ark_mem->nconstrfails;
  return (ARK_SUCCESS);
}